

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_CONTEXT_Unmarshal(TPMS_CONTEXT *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  TPM_RC TVar2;
  UINT64 UVar3;
  
  iVar1 = *size;
  *size = iVar1 + -8;
  TVar2 = 0x9a;
  if (7 < iVar1) {
    UVar3 = ByteArrayToUint64(*buffer);
    target->sequence = UVar3;
    *buffer = *buffer + 8;
    TVar2 = TPMI_DH_CONTEXT_Unmarshal(&target->savedHandle,buffer,size);
    if ((TVar2 == 0) &&
       (TVar2 = TPMI_RH_HIERARCHY_Unmarshal(&target->hierarchy,buffer,size,1), TVar2 == 0)) {
      TVar2 = TPM2B_CONTEXT_DATA_Unmarshal(&target->contextBlob,buffer,size);
      return TVar2;
    }
  }
  return TVar2;
}

Assistant:

TPM_RC
TPMS_CONTEXT_Unmarshal(TPMS_CONTEXT *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT64_Unmarshal((UINT64 *)&(target->sequence), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_DH_CONTEXT_Unmarshal((TPMI_DH_CONTEXT *)&(target->savedHandle), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_RH_HIERARCHY_Unmarshal((TPMI_RH_HIERARCHY *)&(target->hierarchy), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_CONTEXT_DATA_Unmarshal((TPM2B_CONTEXT_DATA *)&(target->contextBlob), buffer, size);
    return result;
}